

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::rel_expr(analysis *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  TreeNode *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  TYPE TVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  analysis *in_RSI;
  NodePtr NVar7;
  NodePtr tmp_cur_ptr;
  NodePtr tmp_ptr;
  NodePtr tmp_in_ptr;
  undefined1 local_e9;
  TreeNode *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  undefined1 local_d0 [24];
  NodePtr local_b8;
  undefined1 local_a8 [40];
  TreeNode *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [32];
  string local_50;
  
  additive_expr((analysis *)local_d0);
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  uVar2 = local_d0._8_8_;
  if (TVar4 == RELOP) {
    token::getVal_abi_cxx11_
              ((string *)local_a8,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar5 = token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                  ,iVar5);
    local_e8 = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
              (a_Stack_e0,&local_e8,(allocator<dh::TreeNode> *)(local_d0 + 0x14),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
               (int *)&local_b8);
    _Var1._M_pi = a_Stack_e0[0]._M_pi;
    this_01 = local_e8;
    a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_e8 = (TreeNode *)0x0;
    if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_);
    }
    token::getVal_abi_cxx11_
              (&local_50,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    match(in_RSI,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_a8._0_4_ = 1;
    TreeNode::setNodeKind(this_01,(int *)local_a8);
    local_a8._0_4_ = 4;
    TreeNode::setKind(this_01,(int *)local_a8);
    TreeNode::appendChild(this_01,(NodePtr *)local_d0);
    if ((element_type *)_Var1._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((shared_ptr<dh::symTab> *)&(_Var1._M_pi)->_M_use_count)->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)&(_Var1._M_pi)->_M_use_count)->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((shared_ptr<dh::symTab> *)&(_Var1._M_pi)->_M_use_count)->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)&(_Var1._M_pi)->_M_use_count)->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      }
    }
    local_80 = this_01;
    this_00 = &local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_e8 = this_01;
    a_Stack_e0[0]._M_pi = _Var1._M_pi;
    local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    while( true ) {
      additive_expr((analysis *)local_a8);
      uVar3 = local_a8._8_8_;
      local_d0._0_8_ = local_a8._0_8_;
      uVar2 = local_d0._8_8_;
      local_a8._0_8_ = (pointer)0x0;
      local_a8._8_8_ = (element_type *)0x0;
      local_d0._8_8_ = uVar3;
      if ((element_type *)uVar2 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
      }
      if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 != RELOP) break;
      token::getVal_abi_cxx11_
                ((string *)local_a8,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_d0._20_4_ =
           token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
      local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TreeNode *)0x0
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
                (this_00,(TreeNode **)&local_b8,(allocator<dh::TreeNode> *)&local_e9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 (int *)(local_d0 + 0x14));
      if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_);
      }
      token::getVal_abi_cxx11_
                ((string *)local_70,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      match(in_RSI,(string *)local_70);
      if ((element_type *)local_70._0_8_ != (element_type *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      local_a8._0_4_ = 1;
      TreeNode::setNodeKind
                (local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (int *)local_a8);
      local_a8._0_4_ = 4;
      TreeNode::setKind(local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,(int *)local_a8);
      TreeNode::appendChild
                (local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (NodePtr *)local_d0);
      TreeNode::appendChild(local_e8,&local_b8);
      local_e8 = local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_e0,this_00);
      if (local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    TreeNode::appendChild(local_e8,(NodePtr *)local_d0);
    this = (analysis *)local_78._M_pi;
    _Var6._M_pi = extraout_RDX_00;
    if ((element_type *)a_Stack_e0[0]._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_e0[0]._M_pi);
      _Var6._M_pi = extraout_RDX_01;
    }
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)->_vptr__Sp_counted_base =
         (_func_int **)local_80;
    (((shared_ptr<dh::symTab> *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)->_M_use_count)->
    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)_Var1._M_pi
    ;
  }
  else {
    this->layer_record = local_d0._0_4_;
    this->initFlag = (bool)local_d0[4];
    *(undefined3 *)&this->field_0x5 = local_d0._5_3_;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d0._8_8_ = (element_type *)0x0;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar2;
    local_d0._0_8_ = (element_type *)0x0;
    _Var6._M_pi = extraout_RDX;
  }
  if ((element_type *)local_d0._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
    _Var6._M_pi = extraout_RDX_02;
  }
  NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::rel_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in rel_expr\n";
#endif
	
	NodePtr ret;
	NodePtr tmp_ptr = additive_expr();

	if ( tmp->getType() == TYPE::RELOP)
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
		match(tmp->getVal());

		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::RelK);
		ret->appendChild(tmp_ptr);

		NodePtr tmp_cur_ptr = ret;
		while (1)
		{
			tmp_ptr = additive_expr();

			if ( tmp->getType() == TYPE::RELOP)
			{
				NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
				match(tmp->getVal());
				tmp_in_ptr->setNodeKind(NodeKind::ExprK);
				tmp_in_ptr->setKind(ExprKind::RelK);
				tmp_in_ptr->appendChild(tmp_ptr);

				tmp_cur_ptr->appendChild(tmp_in_ptr);
				tmp_cur_ptr = tmp_in_ptr;
			} else 
			{
				tmp_cur_ptr->appendChild(tmp_ptr);
				break;
			}
		}

	} else 
	{
		return tmp_ptr;
	}

	return ret;
}